

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gameclient.cpp
# Opt level: O0

int __thiscall CGameClient::GetClientID(CGameClient *this,char *pName)

{
  int iVar1;
  char *in_RDI;
  int i;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar2;
  
  iVar2 = 0;
  while( true ) {
    if (0x3f < iVar2) {
      return -1;
    }
    if ((((in_RDI[(long)iVar2 * 0x5b0 + 0x4aec] & 1U) != 0) && (iVar2 != *(int *)(in_RDI + 0x1b140))
        ) && (iVar1 = str_comp((char *)CONCAT44(iVar2,in_stack_ffffffffffffffe0),in_RDI), iVar1 == 0
             )) break;
    iVar2 = iVar2 + 1;
  }
  return iVar2;
}

Assistant:

int CGameClient::GetClientID(const char *pName)
{
	for(int i = 0; i < MAX_CLIENTS; i++)
	{
		if(!m_aClients[i].m_Active || i == m_LocalClientID) // skip local user
			continue;

		if(!str_comp(m_aClients[i].m_aName, pName))
			return i;
	}

	return -1;
}